

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QLocale __thiscall QVariant::toLocale(QVariant *this)

{
  QLocalePrivate *pQVar1;
  QLocalePrivate *pQVar2;
  bool bVar3;
  QLocale *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QLocale>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)((ulong)in_RSI[3].d.d.ptr & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((ulong)in_RSI[3].d.d.ptr & 1) != 0) {
      pQVar1 = (in_RSI->d).d.ptr;
      in_RSI = (QLocale *)((long)&pQVar1->m_data + (long)*(int *)((long)&pQVar1->m_data + 4));
    }
    QLocale::QLocale((QLocale *)this,in_RSI);
  }
  else {
    (this->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale((QLocale *)this);
    pQVar1 = in_RSI[3].d.d.ptr;
    if (((ulong)pQVar1 & 1) != 0) {
      pQVar2 = (in_RSI->d).d.ptr;
      in_RSI = (QLocale *)((long)&pQVar2->m_data + (long)*(int *)((long)&pQVar2->m_data + 4));
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)pQVar1 & 0xfffffffffffffffc),in_RSI,local_20,
                       this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QLocale QVariant::toLocale() const
{
    return qvariant_cast<QLocale>(*this);
}